

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O2

int CfdFreePsbtPubkeyList(void *handle,void *pubkey_list_handle)

{
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *this;
  allocator local_41;
  string local_40;
  
  cfd::Initialize();
  if (pubkey_list_handle != (void *)0x0) {
    std::__cxx11::string::string((string *)&local_40,"PsbtPubkeyList",&local_41);
    cfd::capi::CheckBuffer(pubkey_list_handle,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    this = *(vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> **)
            ((long)pubkey_list_handle + 0x18);
    if (this != (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)0x0) {
      std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector(this);
      operator_delete(this);
      *(undefined8 *)((long)pubkey_list_handle + 0x18) = 0;
    }
    std::__cxx11::string::string((string *)&local_40,"PsbtPubkeyList",&local_41);
    cfd::capi::FreeBuffer(pubkey_list_handle,&local_40,0x20);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return 0;
}

Assistant:

int CfdFreePsbtPubkeyList(void* handle, void* pubkey_list_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (pubkey_list_handle != nullptr) {
      CheckBuffer(pubkey_list_handle, kPrefixPsbtPubkeyList);
      CfdCapiPsbtPubkeyListHandle* list_handle =
          static_cast<CfdCapiPsbtPubkeyListHandle*>(pubkey_list_handle);
      if (list_handle->key_list != nullptr) {
        delete list_handle->key_list;
        list_handle->key_list = nullptr;
      }
      FreeBuffer(
          pubkey_list_handle, kPrefixPsbtPubkeyList,
          sizeof(CfdCapiPsbtPubkeyListHandle));
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}